

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-platform-output.c
# Opt level: O1

int run_test_platform_output(void)

{
  uv_poll_t *handle;
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  char *unaff_RBX;
  sockaddr_in6 *psVar4;
  long unaff_R14;
  char *unaff_R15;
  long lVar5;
  int count;
  uv_cpu_info_t *cpus;
  uv_interface_address_t *interfaces;
  double uptime;
  size_t rss;
  uv_passwd_t pwd;
  size_t size;
  uv_rusage_t rusage;
  char buffer [512];
  uv_utsname_t uname;
  uv_poll_t auStack_2f40 [64];
  char *pcStack_740;
  long lStack_738;
  char *pcStack_730;
  uint local_728;
  int local_71c;
  uv_cpu_info_t *local_718;
  uv_interface_address_t *local_710;
  double local_708;
  size_t local_700;
  uv_passwd_t local_6f8;
  size_t local_6d0;
  uv_rusage_t local_6c8;
  char local_638 [520];
  uv_utsname_t local_430;
  
  pcStack_730 = (char *)0x16403b;
  iVar1 = uv_get_process_title(local_638,0x200);
  if (iVar1 == 0) {
    unaff_RBX = local_638;
    pcStack_730 = (char *)0x16405c;
    printf("uv_get_process_title: %s\n",unaff_RBX);
    local_6d0 = 0x200;
    pcStack_730 = (char *)0x164070;
    iVar1 = uv_cwd(unaff_RBX,&local_6d0);
    if (iVar1 != 0) goto LAB_00164553;
    pcStack_730 = (char *)0x16408e;
    printf("uv_cwd: %s\n",local_638);
    pcStack_730 = (char *)0x164098;
    iVar1 = uv_resident_set_memory(&local_700);
    if (iVar1 != 0) goto LAB_00164558;
    pcStack_730 = (char *)0x1640b3;
    printf("uv_resident_set_memory: %llu\n",local_700);
    pcStack_730 = (char *)0x1640bd;
    iVar1 = uv_uptime(&local_708);
    if (iVar1 != 0) goto LAB_0016455d;
    if (local_708 <= 0.0) goto LAB_00164562;
    pcStack_730 = (char *)0x1640e7;
    printf("uv_uptime: %f\n");
    pcStack_730 = (char *)0x1640f1;
    iVar1 = uv_getrusage(&local_6c8);
    if (iVar1 != 0) goto LAB_00164567;
    if (local_6c8.ru_utime.tv_sec < 0) goto LAB_0016456c;
    if (local_6c8.ru_utime.tv_usec < 0) goto LAB_00164571;
    if (local_6c8.ru_stime.tv_sec < 0) goto LAB_00164576;
    if (local_6c8.ru_stime.tv_usec < 0) goto LAB_0016457b;
    pcStack_730 = (char *)0x164135;
    puts("uv_getrusage:");
    pcStack_730 = (char *)0x16414d;
    printf("  user: %llu sec %llu microsec\n",local_6c8.ru_utime.tv_sec,local_6c8.ru_utime.tv_usec);
    pcStack_730 = (char *)0x164165;
    printf("  system: %llu sec %llu microsec\n",local_6c8.ru_stime.tv_sec,local_6c8.ru_stime.tv_usec
          );
    pcStack_730 = (char *)0x16417b;
    printf("  page faults: %llu\n",local_6c8.ru_majflt);
    pcStack_730 = (char *)0x164191;
    printf("  maximum resident set size: %llu\n",local_6c8.ru_maxrss);
    pcStack_730 = (char *)0x1641a0;
    iVar1 = uv_cpu_info(&local_718,&local_71c);
    if (iVar1 != 0) goto LAB_00164580;
    pcStack_730 = (char *)0x1641b4;
    puts("uv_cpu_info:");
    if (0 < local_71c) {
      unaff_RBX = "  times.nice: %llu\n";
      unaff_R14 = 0;
      unaff_R15 = (char *)0x0;
      do {
        pcStack_730 = (char *)0x1641f9;
        printf("  model: %s\n",*(undefined8 *)((long)&local_718->model + unaff_R14));
        pcStack_730 = (char *)0x164211;
        printf("  speed: %d\n",(ulong)*(uint *)((long)&local_718->speed + unaff_R14));
        pcStack_730 = (char *)0x164229;
        printf("  times.sys: %llu\n",*(undefined8 *)((long)&(local_718->cpu_times).sys + unaff_R14))
        ;
        pcStack_730 = (char *)0x16423d;
        printf("  times.user: %llu\n",
               *(undefined8 *)((long)&(local_718->cpu_times).user + unaff_R14));
        pcStack_730 = (char *)0x164251;
        printf("  times.idle: %llu\n",
               *(undefined8 *)((long)&(local_718->cpu_times).idle + unaff_R14));
        pcStack_730 = (char *)0x164265;
        printf("  times.irq: %llu\n",*(undefined8 *)((long)&(local_718->cpu_times).irq + unaff_R14))
        ;
        pcStack_730 = (char *)0x164279;
        printf("  times.nice: %llu\n",
               *(undefined8 *)((long)&(local_718->cpu_times).nice + unaff_R14));
        unaff_R15 = unaff_R15 + 1;
        unaff_R14 = unaff_R14 + 0x38;
      } while ((long)unaff_R15 < (long)local_71c);
    }
    pcStack_730 = (char *)0x164298;
    uv_free_cpu_info(local_718,local_71c);
    pcStack_730 = (char *)0x1642a7;
    iVar1 = uv_interface_addresses(&local_710,&local_71c);
    if (iVar1 != 0) goto LAB_00164585;
    pcStack_730 = (char *)0x1642bb;
    puts("uv_interface_addresses:");
    if (0 < local_71c) {
      unaff_R15 = "  physical address: ";
      unaff_RBX = (char *)0x0;
      unaff_R14 = 0;
      do {
        pcStack_730 = (char *)0x164300;
        printf("  name: %s\n",*(undefined8 *)(unaff_RBX + (long)(local_710->phys_addr + -8)));
        pcStack_730 = (char *)0x164317;
        printf("  internal: %d\n",(ulong)*(uint *)((long)&local_710->is_internal + (long)unaff_RBX))
        ;
        pcStack_730 = (char *)0x164321;
        printf("  physical address: ");
        local_728 = (uint)(byte)(local_710->phys_addr + 5)[(long)unaff_RBX];
        pcStack_730 = (char *)0x164353;
        printf("%02x:%02x:%02x:%02x:%02x:%02x\n",(ulong)(byte)local_710->phys_addr[(long)unaff_RBX],
               (ulong)(byte)(local_710->phys_addr + 1)[(long)unaff_RBX],
               (ulong)(byte)(local_710->phys_addr + 2)[(long)unaff_RBX],
               (ulong)(byte)(local_710->phys_addr + 3)[(long)unaff_RBX],
               (ulong)(byte)(local_710->phys_addr + 4)[(long)unaff_RBX]);
        psVar4 = (sockaddr_in6 *)(unaff_RBX + (long)(local_710->phys_addr + 0xc));
        if (psVar4->sin6_family == 10) {
          pcStack_730 = (char *)0x164389;
          uv_ip6_name(psVar4,local_638,0x200);
        }
        else if (psVar4->sin6_family == 2) {
          pcStack_730 = (char *)0x16437a;
          uv_ip4_name((sockaddr_in *)psVar4,local_638,0x200);
        }
        pcStack_730 = (char *)0x164396;
        printf("  address: %s\n",local_638);
        psVar4 = (sockaddr_in6 *)(unaff_RBX + (long)(local_710->phys_addr + 0x28));
        if (psVar4->sin6_family == 10) {
          pcStack_730 = (char *)0x1643cc;
          uv_ip6_name(psVar4,local_638,0x200);
LAB_001643cc:
          pcStack_730 = (char *)0x1643dd;
          printf("  netmask: %s\n",local_638);
        }
        else {
          if (psVar4->sin6_family == 2) {
            pcStack_730 = (char *)0x1643bd;
            uv_ip4_name((sockaddr_in *)psVar4,local_638,0x200);
            goto LAB_001643cc;
          }
          pcStack_730 = (char *)0x1643eb;
          puts("  netmask: none");
        }
        unaff_R14 = unaff_R14 + 1;
        unaff_RBX = unaff_RBX + 0x50;
      } while (unaff_R14 < local_71c);
    }
    pcStack_730 = (char *)0x16440a;
    uv_free_interface_addresses(local_710,local_71c);
    pcStack_730 = (char *)0x164414;
    iVar1 = uv_os_get_passwd(&local_6f8);
    if (iVar1 != 0) goto LAB_0016458a;
    pcStack_730 = (char *)0x164428;
    puts("uv_os_get_passwd:");
    pcStack_730 = (char *)0x16443b;
    printf("  euid: %ld\n",local_6f8.uid);
    pcStack_730 = (char *)0x16444e;
    printf("  gid: %ld\n",local_6f8.gid);
    pcStack_730 = (char *)0x164461;
    printf("  username: %s\n",local_6f8.username);
    pcStack_730 = (char *)0x164474;
    printf("  shell: %s\n",local_6f8.shell);
    pcStack_730 = (char *)0x164487;
    printf("  home directory: %s\n",local_6f8.homedir);
    pcStack_730 = (char *)0x16448c;
    uVar2 = uv_os_getpid();
    if ((int)uVar2 < 1) goto LAB_0016458f;
    pcStack_730 = (char *)0x1644a4;
    printf("uv_os_getpid: %d\n",(ulong)uVar2);
    pcStack_730 = (char *)0x1644a9;
    uVar2 = uv_os_getppid();
    if (0 < (int)uVar2) {
      pcStack_730 = (char *)0x1644c1;
      printf("uv_os_getppid: %d\n",(ulong)uVar2);
      pcStack_730 = (char *)0x1644ce;
      iVar1 = uv_os_uname(&local_430);
      if (iVar1 == 0) {
        pcStack_730 = (char *)0x1644e2;
        puts("uv_os_uname:");
        pcStack_730 = (char *)0x1644f8;
        printf("  sysname: %s\n",&local_430);
        pcStack_730 = (char *)0x16450e;
        printf("  release: %s\n",local_430.release);
        pcStack_730 = (char *)0x164524;
        printf("  version: %s\n",local_430.version);
        pcStack_730 = (char *)0x16453a;
        printf("  machine: %s\n",local_430.machine);
        return 0;
      }
      goto LAB_00164599;
    }
  }
  else {
    pcStack_730 = (char *)0x164553;
    run_test_platform_output_cold_1();
LAB_00164553:
    pcStack_730 = (char *)0x164558;
    run_test_platform_output_cold_2();
LAB_00164558:
    pcStack_730 = (char *)0x16455d;
    run_test_platform_output_cold_3();
LAB_0016455d:
    pcStack_730 = (char *)0x164562;
    run_test_platform_output_cold_4();
LAB_00164562:
    pcStack_730 = (char *)0x164567;
    run_test_platform_output_cold_5();
LAB_00164567:
    pcStack_730 = (char *)0x16456c;
    run_test_platform_output_cold_6();
LAB_0016456c:
    pcStack_730 = (char *)0x164571;
    run_test_platform_output_cold_7();
LAB_00164571:
    pcStack_730 = (char *)0x164576;
    run_test_platform_output_cold_8();
LAB_00164576:
    pcStack_730 = (char *)0x16457b;
    run_test_platform_output_cold_9();
LAB_0016457b:
    pcStack_730 = (char *)0x164580;
    run_test_platform_output_cold_10();
LAB_00164580:
    pcStack_730 = (char *)0x164585;
    run_test_platform_output_cold_11();
LAB_00164585:
    pcStack_730 = (char *)0x16458a;
    run_test_platform_output_cold_12();
LAB_0016458a:
    pcStack_730 = (char *)0x16458f;
    run_test_platform_output_cold_13();
LAB_0016458f:
    pcStack_730 = (char *)0x164594;
    run_test_platform_output_cold_14();
  }
  pcStack_730 = (char *)0x164599;
  run_test_platform_output_cold_15();
LAB_00164599:
  pcStack_730 = (char *)0x16459e;
  run_test_platform_output_cold_16();
  lVar5 = 0;
  pcStack_740 = unaff_RBX;
  lStack_738 = unaff_R14;
  pcStack_730 = unaff_R15;
  do {
    iVar1 = socket(2,1,0);
    puVar3 = uv_default_loop();
    handle = (uv_poll_t *)((long)auStack_2f40[0].handle_queue + lVar5 + -0x20);
    uv_poll_init_socket(puVar3,handle,iVar1);
    uv_poll_start(handle,3,(uv_poll_cb)0x0);
    lVar5 = lVar5 + 0xa0;
  } while (lVar5 != 0x2800);
  lVar5 = 0;
  do {
    uv_close((uv_handle_t *)((long)auStack_2f40[0].handle_queue + lVar5 + -0x20),close_cb);
    lVar5 = lVar5 + 0xa0;
  } while (lVar5 != 0x2800);
  puVar3 = uv_default_loop();
  uv_run(puVar3,UV_RUN_DEFAULT);
  if (close_cb_called == 0x40) {
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_poll_close_cold_1();
  }
  run_test_poll_close_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(platform_output) {
  char buffer[512];
  size_t rss;
  size_t size;
  double uptime;
  uv_pid_t pid;
  uv_pid_t ppid;
  uv_rusage_t rusage;
  uv_cpu_info_t* cpus;
  uv_interface_address_t* interfaces;
  uv_passwd_t pwd;
  uv_utsname_t uname;
  int count;
  int i;
  int err;

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT(err == 0);
  printf("uv_get_process_title: %s\n", buffer);

  size = sizeof(buffer);
  err = uv_cwd(buffer, &size);
  ASSERT(err == 0);
  printf("uv_cwd: %s\n", buffer);

  err = uv_resident_set_memory(&rss);
#if defined(__MSYS__)
  ASSERT(err == UV_ENOSYS);
#else
  ASSERT(err == 0);
  printf("uv_resident_set_memory: %llu\n", (unsigned long long) rss);
#endif

  err = uv_uptime(&uptime);
#if defined(__PASE__)
  ASSERT(err == UV_ENOSYS);
#else
  ASSERT(err == 0);
  ASSERT(uptime > 0);
  printf("uv_uptime: %f\n", uptime);
#endif

  err = uv_getrusage(&rusage);
  ASSERT(err == 0);
  ASSERT(rusage.ru_utime.tv_sec >= 0);
  ASSERT(rusage.ru_utime.tv_usec >= 0);
  ASSERT(rusage.ru_stime.tv_sec >= 0);
  ASSERT(rusage.ru_stime.tv_usec >= 0);
  printf("uv_getrusage:\n");
  printf("  user: %llu sec %llu microsec\n",
         (unsigned long long) rusage.ru_utime.tv_sec,
         (unsigned long long) rusage.ru_utime.tv_usec);
  printf("  system: %llu sec %llu microsec\n",
         (unsigned long long) rusage.ru_stime.tv_sec,
         (unsigned long long) rusage.ru_stime.tv_usec);
  printf("  page faults: %llu\n", (unsigned long long) rusage.ru_majflt);
  printf("  maximum resident set size: %llu\n",
         (unsigned long long) rusage.ru_maxrss);

  err = uv_cpu_info(&cpus, &count);
#if defined(__CYGWIN__) || defined(__MSYS__)
  ASSERT(err == UV_ENOSYS);
#else
  ASSERT(err == 0);

  printf("uv_cpu_info:\n");
  for (i = 0; i < count; i++) {
    printf("  model: %s\n", cpus[i].model);
    printf("  speed: %d\n", cpus[i].speed);
    printf("  times.sys: %llu\n", (unsigned long long) cpus[i].cpu_times.sys);
    printf("  times.user: %llu\n",
           (unsigned long long) cpus[i].cpu_times.user);
    printf("  times.idle: %llu\n",
           (unsigned long long) cpus[i].cpu_times.idle);
    printf("  times.irq: %llu\n",  (unsigned long long) cpus[i].cpu_times.irq);
    printf("  times.nice: %llu\n",
           (unsigned long long) cpus[i].cpu_times.nice);
  }
#endif
  uv_free_cpu_info(cpus, count);

  err = uv_interface_addresses(&interfaces, &count);
  ASSERT(err == 0);

  printf("uv_interface_addresses:\n");
  for (i = 0; i < count; i++) {
    printf("  name: %s\n", interfaces[i].name);
    printf("  internal: %d\n", interfaces[i].is_internal);
    printf("  physical address: ");
    printf("%02x:%02x:%02x:%02x:%02x:%02x\n",
           (unsigned char)interfaces[i].phys_addr[0],
           (unsigned char)interfaces[i].phys_addr[1],
           (unsigned char)interfaces[i].phys_addr[2],
           (unsigned char)interfaces[i].phys_addr[3],
           (unsigned char)interfaces[i].phys_addr[4],
           (unsigned char)interfaces[i].phys_addr[5]);

    if (interfaces[i].address.address4.sin_family == AF_INET) {
      uv_ip4_name(&interfaces[i].address.address4, buffer, sizeof(buffer));
    } else if (interfaces[i].address.address4.sin_family == AF_INET6) {
      uv_ip6_name(&interfaces[i].address.address6, buffer, sizeof(buffer));
    }

    printf("  address: %s\n", buffer);

    if (interfaces[i].netmask.netmask4.sin_family == AF_INET) {
      uv_ip4_name(&interfaces[i].netmask.netmask4, buffer, sizeof(buffer));
      printf("  netmask: %s\n", buffer);
    } else if (interfaces[i].netmask.netmask4.sin_family == AF_INET6) {
      uv_ip6_name(&interfaces[i].netmask.netmask6, buffer, sizeof(buffer));
      printf("  netmask: %s\n", buffer);
    } else {
      printf("  netmask: none\n");
    }
  }
  uv_free_interface_addresses(interfaces, count);

  err = uv_os_get_passwd(&pwd);
  ASSERT(err == 0);

  printf("uv_os_get_passwd:\n");
  printf("  euid: %ld\n", pwd.uid);
  printf("  gid: %ld\n", pwd.gid);
  printf("  username: %s\n", pwd.username);
  printf("  shell: %s\n", pwd.shell);
  printf("  home directory: %s\n", pwd.homedir);

  pid = uv_os_getpid();
  ASSERT(pid > 0);
  printf("uv_os_getpid: %d\n", (int) pid);
  ppid = uv_os_getppid();
  ASSERT(ppid > 0);
  printf("uv_os_getppid: %d\n", (int) ppid);

  err = uv_os_uname(&uname);
  ASSERT(err == 0);
  printf("uv_os_uname:\n");
  printf("  sysname: %s\n", uname.sysname);
  printf("  release: %s\n", uname.release);
  printf("  version: %s\n", uname.version);
  printf("  machine: %s\n", uname.machine);

  return 0;
}